

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

string * trim(string *s)

{
  bool bVar1;
  string *in_RDI;
  iterator_type wsback;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  wsfront;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff68;
  string *this;
  allocator<char> *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  byte bVar2;
  allocator<char> in_stack_ffffffffffffff97;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  char *local_38;
  undefined8 local_28;
  undefined8 local_20;
  char *local_18;
  
  this = in_RDI;
  local_20 = std::__cxx11::string::begin();
  local_28 = std::__cxx11::string::end();
  local_18 = (char *)std::
                     find_if_not<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,trim(std::__cxx11::string_const&)::_lambda(int)_1_>
                               (local_20,local_28);
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::
  find_if_not<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,trim(std::__cxx11::string_const&)::_lambda(int)_2_>
            (&local_40,local_48,local_50);
  local_38 = (char *)std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::base(&local_40);
  bVar1 = __gnu_cxx::operator<=
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,in_stack_ffffffffffffff68);
  bVar2 = 0;
  if (bVar1) {
    std::__cxx11::string::string((string *)this);
  }
  else {
    __end._M_current = local_38;
    __beg._M_current = local_18;
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff97,CONCAT16(1,in_stack_ffffffffffffff90)),__beg,__end
               ,in_stack_ffffffffffffff88);
  }
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  return in_RDI;
}

Assistant:

inline std::string trim(const std::string& s) {
	auto wsfront = std::find_if_not(s.begin(), s.end(), [](int c) { return std::isspace(c); });
	auto wsback = std::find_if_not(s.rbegin(), s.rend(), [](int c) { return std::isspace(c); }).base();
	return (wsback <= wsfront ? std::string() : std::string(wsfront, wsback));
}